

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

void tinyexr::ConvertHeader(EXRHeader *exr_header,HeaderInfo *info)

{
  pointer paVar1;
  int iVar2;
  int iVar3;
  EXRChannelInfo *pEVar4;
  int *piVar5;
  EXRAttribute *pEVar6;
  int iVar7;
  int *piVar8;
  pointer p_Var9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  
  exr_header->pixel_aspect_ratio = info->pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info->screen_window_center[0];
  exr_header->screen_window_center[1] = info->screen_window_center[1];
  exr_header->screen_window_width = info->screen_window_width;
  exr_header->chunk_count = info->chunk_count;
  iVar7 = (info->display_window).min_y;
  iVar2 = (info->display_window).max_x;
  iVar3 = (info->display_window).max_y;
  (exr_header->display_window).min_x = (info->display_window).min_x;
  (exr_header->display_window).min_y = iVar7;
  (exr_header->display_window).max_x = iVar2;
  (exr_header->display_window).max_y = iVar3;
  iVar7 = (info->data_window).min_y;
  iVar2 = (info->data_window).max_x;
  iVar3 = (info->data_window).max_y;
  (exr_header->data_window).min_x = (info->data_window).min_x;
  (exr_header->data_window).min_y = iVar7;
  (exr_header->data_window).max_x = iVar2;
  (exr_header->data_window).max_y = iVar3;
  exr_header->line_order = info->line_order;
  exr_header->compression_type = info->compression_type;
  iVar7 = info->tile_size_y;
  iVar2 = info->tile_level_mode;
  iVar3 = info->tile_rounding_mode;
  exr_header->tile_size_x = info->tile_size_x;
  exr_header->tile_size_y = iVar7;
  exr_header->tile_level_mode = iVar2;
  exr_header->tile_rounding_mode = iVar3;
  iVar7 = (int)((long)(info->channels).
                      super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(info->channels).
                      super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x55555555;
  exr_header->num_channels = iVar7;
  pEVar4 = (EXRChannelInfo *)malloc((long)iVar7 * 0x110);
  exr_header->channels = pEVar4;
  uVar10 = (ulong)exr_header->num_channels;
  if (uVar10 != 0) {
    lVar13 = 0;
    lVar11 = 0;
    uVar12 = 0;
    do {
      strncpy(exr_header->channels->name + lVar11,
              *(char **)(((info->channels).
                          super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start)->pad + lVar13 + -0x2d),0xff);
      exr_header->channels->pad[lVar11 + -0xe] = '\0';
      paVar1 = (info->channels).
               super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pEVar4 = exr_header->channels;
      *(undefined4 *)(pEVar4->pad + lVar11 + -0xd) =
           *(undefined4 *)(paVar1->pad + lVar13 + 0xfffffffffffffff3);
      pEVar4->pad[lVar11 + -1] = paVar1->pad[lVar13 + 0xffffffffffffffff];
      *(undefined8 *)(pEVar4->pad + lVar11 + -9) =
           *(undefined8 *)(paVar1->pad + lVar13 + 0xfffffffffffffff7);
      uVar12 = uVar12 + 1;
      uVar10 = (ulong)exr_header->num_channels;
      lVar11 = lVar11 + 0x110;
      lVar13 = lVar13 + 0x30;
    } while (uVar12 < uVar10);
  }
  piVar5 = (int *)malloc(uVar10 << 2);
  exr_header->pixel_types = piVar5;
  lVar11 = (long)exr_header->num_channels;
  if (lVar11 != 0) {
    piVar8 = &((info->channels).
               super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
               _M_impl.super__Vector_impl_data._M_start)->pixel_type;
    lVar13 = 0;
    do {
      piVar5[lVar13] = *piVar8;
      lVar13 = lVar13 + 1;
      piVar8 = piVar8 + 0xc;
    } while (lVar11 != lVar13);
  }
  piVar5 = (int *)malloc(lVar11 << 2);
  exr_header->requested_pixel_types = piVar5;
  iVar7 = exr_header->num_channels;
  if ((long)iVar7 != 0) {
    piVar8 = &((info->channels).
               super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
               _M_impl.super__Vector_impl_data._M_start)->pixel_type;
    lVar11 = 0;
    do {
      piVar5[lVar11] = *piVar8;
      lVar11 = lVar11 + 1;
      piVar8 = piVar8 + 0xc;
    } while (iVar7 != lVar11);
  }
  iVar7 = (int)((ulong)((long)(info->attributes).
                              super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(info->attributes).
                             super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 4) * 0x3e0f83e1;
  exr_header->num_custom_attributes = iVar7;
  if (iVar7 < 1) {
    exr_header->custom_attributes = (EXRAttribute *)0x0;
  }
  else {
    if (0x80 < iVar7) {
      exr_header->num_custom_attributes = 0x80;
    }
    pEVar6 = (EXRAttribute *)malloc((long)exr_header->num_custom_attributes * 0x210);
    exr_header->custom_attributes = pEVar6;
    p_Var9 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl
        .super__Vector_impl_data._M_finish != p_Var9) {
      lVar11 = 0;
      uVar10 = 0;
      do {
        memcpy(exr_header->custom_attributes->name + lVar11,p_Var9->name + lVar11,0x100);
        memcpy(exr_header->custom_attributes->type + lVar11,
               ((info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>
                ._M_impl.super__Vector_impl_data._M_start)->type + lVar11,0x100);
        p_Var9 = (info->attributes).
                 super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pEVar6 = exr_header->custom_attributes;
        *(undefined4 *)((long)&pEVar6->size + lVar11) =
             *(undefined4 *)((long)&p_Var9->size + lVar11);
        *(undefined8 *)((long)&pEVar6->value + lVar11) =
             *(undefined8 *)((long)&p_Var9->value + lVar11);
        uVar10 = uVar10 + 1;
        p_Var9 = (info->attributes).
                 super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 0x210;
      } while (uVar10 < (ulong)(((long)(info->attributes).
                                       super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var9 >>
                                4) * 0xf83e0f83e0f83e1));
    }
  }
  exr_header->header_len = info->header_len;
  return;
}

Assistant:

static void ConvertHeader(EXRHeader *exr_header, const HeaderInfo &info) {
  exr_header->pixel_aspect_ratio = info.pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info.screen_window_center[0];
  exr_header->screen_window_center[1] = info.screen_window_center[1];
  exr_header->screen_window_width = info.screen_window_width;
  exr_header->chunk_count = info.chunk_count;
  exr_header->display_window.min_x = info.display_window.min_x;
  exr_header->display_window.min_y = info.display_window.min_y;
  exr_header->display_window.max_x = info.display_window.max_x;
  exr_header->display_window.max_y = info.display_window.max_y;
  exr_header->data_window.min_x = info.data_window.min_x;
  exr_header->data_window.min_y = info.data_window.min_y;
  exr_header->data_window.max_x = info.data_window.max_x;
  exr_header->data_window.max_y = info.data_window.max_y;
  exr_header->line_order = info.line_order;
  exr_header->compression_type = info.compression_type;

  exr_header->tile_size_x = info.tile_size_x;
  exr_header->tile_size_y = info.tile_size_y;
  exr_header->tile_level_mode = info.tile_level_mode;
  exr_header->tile_rounding_mode = info.tile_rounding_mode;

  exr_header->num_channels = static_cast<int>(info.channels.size());

  exr_header->channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
#ifdef _MSC_VER
    strncpy_s(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#else
    strncpy(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#endif
    // manually add '\0' for safety.
    exr_header->channels[c].name[255] = '\0';

    exr_header->channels[c].pixel_type = info.channels[c].pixel_type;
    exr_header->channels[c].p_linear = info.channels[c].p_linear;
    exr_header->channels[c].x_sampling = info.channels[c].x_sampling;
    exr_header->channels[c].y_sampling = info.channels[c].y_sampling;
  }

  exr_header->pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->pixel_types[c] = info.channels[c].pixel_type;
  }

  // Initially fill with values of `pixel_types`
  exr_header->requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->requested_pixel_types[c] = info.channels[c].pixel_type;
  }

  exr_header->num_custom_attributes = static_cast<int>(info.attributes.size());

  if (exr_header->num_custom_attributes > 0) {
    // TODO(syoyo): Report warning when # of attributes exceeds
    // `TINYEXR_MAX_CUSTOM_ATTRIBUTES`
    if (exr_header->num_custom_attributes > TINYEXR_MAX_CUSTOM_ATTRIBUTES) {
      exr_header->num_custom_attributes = TINYEXR_MAX_CUSTOM_ATTRIBUTES;
    }

    exr_header->custom_attributes = static_cast<EXRAttribute *>(malloc(
        sizeof(EXRAttribute) * size_t(exr_header->num_custom_attributes)));

    for (size_t i = 0; i < info.attributes.size(); i++) {
      memcpy(exr_header->custom_attributes[i].name, info.attributes[i].name,
             256);
      memcpy(exr_header->custom_attributes[i].type, info.attributes[i].type,
             256);
      exr_header->custom_attributes[i].size = info.attributes[i].size;
      // Just copy pointer
      exr_header->custom_attributes[i].value = info.attributes[i].value;
    }

  } else {
    exr_header->custom_attributes = NULL;
  }

  exr_header->header_len = info.header_len;
}